

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O2

int BrotliSetDepth(int p0,HuffmanTree *pool,uint8_t *depth,int max_depth)

{
  short sVar1;
  uint uVar2;
  long lVar3;
  int stack [16];
  
  stack[0] = -1;
  uVar2 = 0;
  do {
    while( true ) {
      sVar1 = pool[p0].index_left_;
      if (sVar1 < 0) break;
      if (max_depth <= (int)uVar2) {
        return 0;
      }
      lVar3 = (long)(int)uVar2;
      uVar2 = uVar2 + 1;
      stack[lVar3 + 1] = (int)pool[p0].index_right_or_value_;
      p0 = (int)sVar1;
    }
    depth[pool[p0].index_right_or_value_] = (uint8_t)uVar2;
    while( true ) {
      if ((int)uVar2 < 0) {
        return 1;
      }
      p0 = stack[uVar2];
      if (p0 != -1) break;
      uVar2 = uVar2 - 1;
    }
    stack[uVar2] = -1;
  } while( true );
}

Assistant:

BROTLI_BOOL BrotliSetDepth(
    int p0, HuffmanTree* pool, uint8_t* depth, int max_depth) {
  int stack[16];
  int level = 0;
  int p = p0;
  BROTLI_DCHECK(max_depth <= 15);
  stack[0] = -1;
  while (BROTLI_TRUE) {
    if (pool[p].index_left_ >= 0) {
      level++;
      if (level > max_depth) return BROTLI_FALSE;
      stack[level] = pool[p].index_right_or_value_;
      p = pool[p].index_left_;
      continue;
    } else {
      depth[pool[p].index_right_or_value_] = (uint8_t)level;
    }
    while (level >= 0 && stack[level] == -1) level--;
    if (level < 0) return BROTLI_TRUE;
    p = stack[level];
    stack[level] = -1;
  }
}